

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O3

int h264_residual_cabac(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int cat,int idx,int start,int end,
                       int maxnumcoeff,int coded)

{
  int *piVar1;
  h264_macroblock *cabac_00;
  int iVar2;
  int iVar3;
  vs_dir vVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint32_t coded_block_flag;
  int32_t cam1;
  uint32_t significant_coeff_flag [64];
  uint32_t last_significant_coeff_flag [64];
  uint32_t local_25c;
  h264_macroblock *local_258;
  int local_24c;
  uint local_248;
  uint local_244;
  long local_240;
  uint32_t local_238 [64];
  uint32_t local_138 [66];
  
  local_25c = 0;
  if (0 < maxnumcoeff) {
    uVar6 = 0;
    do {
      if (block[uVar6] != 0) {
        local_25c = 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)maxnumcoeff != uVar6);
  }
  local_258 = mb;
  if (coded == 0) {
    iVar2 = vs_infer(str,&local_25c,0);
  }
  else if ((maxnumcoeff == 0x40) && (slice->chroma_array_type != 3)) {
    iVar2 = vs_infer(str,&local_25c,1);
  }
  else {
    iVar2 = h264_coded_block_flag(str,cabac,cat,idx,&local_25c);
  }
  iVar3 = 1;
  if (iVar2 == 0) {
    switch(cat) {
    case 0:
      local_258->coded_block_flag[0][0x10] = local_25c;
      break;
    case 1:
    case 2:
      local_258->coded_block_flag[0][idx] = local_25c;
      break;
    case 3:
      local_258->coded_block_flag[idx + 1][0x10] = local_25c;
      break;
    case 4:
      local_258->coded_block_flag[(idx >> 3) + 1][idx & 7] = local_25c;
      break;
    case 5:
      piVar1 = local_258->coded_block_flag[0] + (idx << 2);
      *piVar1 = local_25c;
      piVar1[1] = local_25c;
      piVar1[2] = local_25c;
      piVar1[3] = local_25c;
      break;
    case 6:
      local_258->coded_block_flag[1][0x10] = local_25c;
      break;
    case 7:
    case 8:
      local_258->coded_block_flag[1][idx] = local_25c;
      break;
    case 9:
      piVar1 = local_258->coded_block_flag[1] + (idx << 2);
      *piVar1 = local_25c;
      piVar1[1] = local_25c;
      piVar1[2] = local_25c;
      piVar1[3] = local_25c;
      break;
    case 10:
      local_258->coded_block_flag[2][0x10] = local_25c;
      break;
    case 0xb:
    case 0xc:
      local_258->coded_block_flag[2][idx] = local_25c;
      break;
    case 0xd:
      piVar1 = local_258->coded_block_flag[2] + (idx << 2);
      *piVar1 = local_25c;
      piVar1[1] = local_25c;
      piVar1[2] = local_25c;
      piVar1[3] = local_25c;
      break;
    default:
      abort();
    }
    if (local_25c == 0) {
      if (0 < maxnumcoeff) {
        uVar6 = 0;
        do {
          if (str->dir == VS_ENCODE) {
            if (block[uVar6] != 0) {
              h264_residual_cabac_cold_2();
              return 1;
            }
          }
          else {
            block[uVar6] = 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)maxnumcoeff != uVar6);
      }
    }
    else {
      uVar9 = 1;
      if (local_258->mb_field_decoding_flag == 0) {
        uVar9 = (uint)(cabac->slice->field_pic_flag != 0);
      }
      local_258 = (h264_macroblock *)cabac;
      memset(local_238,0,0x100);
      memset(local_138,0,0x100);
      vVar4 = str->dir;
      if (vVar4 == VS_ENCODE) {
        if (maxnumcoeff < 1) {
LAB_001050f0:
          __assert_fail("last != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/vstream/h264_residual.c"
                        ,0xce,
                        "int h264_residual_cabac(struct bitstream *, struct h264_cabac_context *, struct h264_slice *, struct h264_macroblock *, int32_t *, int, int, int, int, int, int)"
                       );
        }
        uVar7 = 0xffffffff;
        uVar6 = 0;
        do {
          if (block[uVar6] == 0) {
            local_238[uVar6] = 0;
          }
          else {
            if (((long)uVar6 < (long)start) || ((long)end < (long)uVar6)) {
              h264_residual_cabac_cold_1();
              return 1;
            }
            local_238[uVar6] = 1;
            uVar7 = uVar6 & 0xffffffff;
          }
          local_138[uVar6] = 0;
          uVar6 = uVar6 + 1;
        } while ((uint)maxnumcoeff != uVar6);
        if ((int)uVar7 == -1) goto LAB_001050f0;
        local_138[(int)uVar7] = 1;
      }
      local_24c = cat;
      if (start < end) {
        iVar2 = end + 1;
        lVar8 = (long)start;
        do {
          iVar5 = (int)lVar8;
          iVar3 = h264_significant_coeff_flag
                            (str,(h264_cabac_context *)local_258,uVar9,local_24c,iVar5,0,
                             local_238 + lVar8);
          if (iVar3 != 0) {
            return 1;
          }
          if (local_238[lVar8] != 0) {
            iVar3 = h264_significant_coeff_flag
                              (str,(h264_cabac_context *)local_258,uVar9,local_24c,iVar5,1,
                               local_138 + lVar8);
            if (iVar3 != 0) {
              return 1;
            }
            if (local_138[lVar8] != 0) {
              iVar2 = iVar5 + 1;
            }
          }
          lVar8 = lVar8 + 1;
          end = iVar2 + -1;
        } while (lVar8 < end);
        vVar4 = str->dir;
      }
      local_238[end] = 1;
      if (vVar4 == VS_DECODE && 0 < maxnumcoeff) {
        memset(block,0,(ulong)(uint)maxnumcoeff << 2);
      }
      cabac_00 = local_258;
      if (start <= end) {
        local_240 = (long)start;
        lVar8 = (long)end + 1;
        iVar2 = 0;
        iVar3 = 0;
        do {
          if (local_238[lVar8 + -1] != 0) {
            local_248 = block[lVar8 + -1];
            local_244 = -local_248;
            if (0 < (int)local_248) {
              local_244 = local_248;
            }
            local_244 = local_244 - 1;
            local_248 = local_248 >> 0x1f;
            iVar5 = h264_coeff_abs_level_minus1
                              (str,(h264_cabac_context *)cabac_00,local_24c,iVar3,iVar2,
                               (int32_t *)&local_244);
            if ((iVar5 != 0) ||
               (iVar5 = h264_cabac_bypass(str,(h264_cabac_context *)cabac_00,&local_248), iVar5 != 0
               )) {
              return 1;
            }
            if (str->dir == VS_DECODE) {
              uVar9 = ~local_244;
              if (local_248 == 0) {
                uVar9 = local_244 + 1;
              }
              block[lVar8 + -1] = uVar9;
            }
            iVar3 = iVar3 + (uint)(local_244 == 0);
            iVar2 = iVar2 + (uint)(local_244 != 0);
          }
          lVar8 = lVar8 + -1;
        } while (local_240 < lVar8);
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int h264_residual_cabac(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	int i;
	uint32_t coded_block_flag = 0;
	for (i = 0 ; i < maxnumcoeff; i++)
		if (block[i])
			coded_block_flag = 1;
	if (coded) {
		if (maxnumcoeff != 64 || slice->chroma_array_type == 3) {
			if (h264_coded_block_flag(str, cabac, cat, idx, &coded_block_flag)) return 1;
		} else {
			if (vs_infer(str, &coded_block_flag, 1)) return 1;
		}
	} else {
		if (vs_infer(str, &coded_block_flag, 0)) return 1;
	}
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
			mb->coded_block_flag[0][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
			mb->coded_block_flag[0][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
			mb->coded_block_flag[0][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
			mb->coded_block_flag[1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
			mb->coded_block_flag[1][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_8X8:
			mb->coded_block_flag[1][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
			mb->coded_block_flag[2][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mb->coded_block_flag[2][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_8X8:
			mb->coded_block_flag[2][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mb->coded_block_flag[idx+1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mb->coded_block_flag[(idx >> 3)+1][idx & 7] = coded_block_flag;
			break;
		default:
			abort();
	}
	if (coded_block_flag) {
		int field = mb->mb_field_decoding_flag || cabac->slice->field_pic_flag;
		uint32_t significant_coeff_flag[64] = { 0 };
		uint32_t last_significant_coeff_flag[64] = { 0 };
		if (str->dir == VS_ENCODE) {
			int last = -1;
			for (i = 0; i < maxnumcoeff; i++) {
				if (block[i]) {
					if (i < start || i > end) {
						fprintf (stderr, "Non-zero coordinate outside start..end!\n");
						return 1;
					}
					significant_coeff_flag[i] = 1;
					last = i;
				} else {
					significant_coeff_flag[i] = 0;
				}
				last_significant_coeff_flag[i] = 0;
			}
			assert(last != -1);
			last_significant_coeff_flag[last] = 1;
		}
		int numcoeff = end + 1;
		for (i = start; i < numcoeff - 1; i++) {
			if (h264_significant_coeff_flag(str, cabac, field, cat, i, 0, &significant_coeff_flag[i])) return 1;
			if (significant_coeff_flag[i]) {
				if (h264_significant_coeff_flag(str, cabac, field, cat, i, 1, &last_significant_coeff_flag[i])) return 1;
				if (last_significant_coeff_flag[i]) {
					numcoeff = i + 1;
				}
			}
		}
		significant_coeff_flag[numcoeff-1] = 1;
		if (str->dir == VS_DECODE) {
			for (i = 0; i < maxnumcoeff; i++)
				block[i] = 0;
		}
		int num1 = 0, numgt1 = 0;
		for (i = numcoeff - 1; i >= start; i--) {
			if (significant_coeff_flag[i]) {
				int32_t cam1 = abs(block[i]) - 1;
				uint32_t s = block[i] < 0;
				if (h264_coeff_abs_level_minus1(str, cabac, cat, num1, numgt1, &cam1)) return 1;
				if (h264_cabac_bypass(str, cabac, &s)) return 1;
				if (cam1)
					numgt1++;
				else
					num1++;
				if (str->dir == VS_DECODE)
					block[i] = (s ? -(cam1 + 1) : cam1 + 1);
			}
		}
	} else {
		for (i = 0; i < maxnumcoeff; i++) {
			if (str->dir == VS_ENCODE) {
				if (block[i]) {
					fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
					return 1;
				}
			} else {
				block[i] = 0;
			}
		}
	}
	return 0;
}